

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::Synth::setReverbCompatibilityMode(Synth *this,bool mt32CompatibleMode)

{
  BReverbModel *pBVar1;
  bool bVar2;
  long lVar3;
  
  if (this->opened == true) {
    bVar2 = isMT32ReverbCompatibilityMode(this);
    if (bVar2 != mt32CompatibleMode) {
      pBVar1 = this->reverbModel;
      setReverbEnabled(this,false);
      for (lVar3 = 0x2026; lVar3 != 0x202a; lVar3 = lVar3 + 1) {
        if (*(long **)(this->controlROMData + lVar3 * 8 + -0x60) != (long *)0x0) {
          (**(code **)(**(long **)(this->controlROMData + lVar3 * 8 + -0x60) + 8))();
        }
      }
      initReverbModels(this,mt32CompatibleMode);
      setReverbEnabled(this,pBVar1 != (BReverbModel *)0x0);
      setReverbOutputGain(this,this->reverbOutputGain);
      return;
    }
  }
  return;
}

Assistant:

void Synth::setReverbCompatibilityMode(bool mt32CompatibleMode) {
	if (!opened || (isMT32ReverbCompatibilityMode() == mt32CompatibleMode)) return;
	bool oldReverbEnabled = isReverbEnabled();
	setReverbEnabled(false);
	for (int i = REVERB_MODE_ROOM; i <= REVERB_MODE_TAP_DELAY; i++) {
		delete reverbModels[i];
	}
	initReverbModels(mt32CompatibleMode);
	setReverbEnabled(oldReverbEnabled);
	setReverbOutputGain(reverbOutputGain);
}